

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
phmap::priv::btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
::emplace_value<int_const&>
          (btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
           *this,size_type i,allocator_type *alloc,int *args)

{
  byte bVar1;
  byte bVar2;
  field_type fVar3;
  bool bVar4;
  template_ElementType<2UL> *in_RAX;
  template_ElementType<2UL> *ptVar5;
  template_ElementType<2UL> *ptVar6;
  template_ElementType<1UL> *ptVar7;
  template_ElementType<3UL> *ppbVar8;
  ulong uVar9;
  template_ElementType<2UL> *local_38;
  ulong uVar10;
  
  local_38 = in_RAX;
  bVar1 = btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
          ::count((btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
                   *)this);
  if (i <= bVar1) {
    bVar1 = btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
            ::count((btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
                     *)this);
    if (i < bVar1) {
      bVar1 = btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
              ::count((btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
                       *)this);
      bVar2 = btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
              ::count((btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
                       *)this);
      local_38 = GetField<2ul>(this);
      local_38 = local_38 + ((ulong)bVar2 - 1);
      value_init<int*>(this,(ulong)bVar1,alloc,&local_38);
      bVar1 = btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
              ::count((btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
                       *)this);
      uVar10 = (ulong)bVar1;
      while (uVar9 = uVar10 - 1, i < uVar9) {
        ptVar5 = GetField<2ul>(this);
        ptVar6 = GetField<2ul>(this);
        ptVar6[uVar9] = ptVar5[uVar10 - 2];
        uVar10 = uVar9;
      }
      btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>::
      value_destroy((btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
                     *)this,i,alloc);
    }
    value_init<int_const&>(this,i,alloc,args);
    fVar3 = btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
            ::count((btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
                     *)this);
    ptVar7 = GetField<1ul>(this);
    ptVar7[2] = fVar3 + '\x01';
    bVar4 = btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
            ::leaf((btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
                    *)this);
    if (!bVar4) {
      bVar1 = btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
              ::count((btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
                       *)this);
      if (i + 1 < (ulong)bVar1) {
        bVar1 = btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
                ::count((btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
                         *)this);
        uVar10 = (ulong)bVar1;
        while ((int)(i + 1) < (int)uVar10) {
          uVar9 = (ulong)((int)uVar10 - 1);
          ppbVar8 = GetField<3ul>(this);
          btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
          ::set_child((btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
                       *)this,uVar10,ppbVar8[uVar9]);
          uVar10 = uVar9;
        }
        GetField<3ul>(this);
      }
    }
    return;
  }
  __assert_fail("i <= count()",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                ,0x852,
                "void phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>>::emplace_value(const size_type, allocator_type *, Args &&...) [Params = phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>, Args = <const int &>]"
               );
}

Assistant:

inline void btree_node<P>::emplace_value(const size_type i,
                                             allocator_type *alloc,
                                             Args &&... args) {
        assert(i <= count());
        // Shift old values to create space for new value and then construct it in
        // place.
        if (i < count()) {
            value_init(count(), alloc, slot(count() - 1));
            for (size_type j = count() - 1; j > i; --j)
                params_type::move(alloc, slot(j - 1), slot(j));
            value_destroy(i, alloc);
        }
        value_init(i, alloc, std::forward<Args>(args)...);
        set_count((field_type)(count() + 1));

        if (!leaf() && count() > i + 1) {
            for (int j = count(); j > (int)(i + 1); --j) {
                set_child(j, child(j - 1));
            }
            clear_child(i + 1);
        }
    }